

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void leveldb::_Test_TableFileIndexData::_RunIt(void)

{
  undefined1 local_b0 [8];
  _Test_TableFileIndexData t;
  
  _Test_TableFileIndexData((_Test_TableFileIndexData *)local_b0);
  _Run((_Test_TableFileIndexData *)local_b0);
  ~_Test_TableFileIndexData((_Test_TableFileIndexData *)local_b0);
  return;
}

Assistant:

TEST(CorruptionTest, TableFileIndexData) {
  Build(10000);  // Enough to build multiple Tables
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();

  Corrupt(kTableFile, -2000, 500);
  Reopen();
  Check(5000, 9999);
}